

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Upsert * sqlite3UpsertOfIndex(Upsert *pUpsert,Index *pIdx)

{
  for (; ((pUpsert != (Upsert *)0x0 && (pUpsert->pUpsertTarget != (ExprList *)0x0)) &&
         (pUpsert->pUpsertIdx != pIdx)); pUpsert = pUpsert->pNextUpsert) {
  }
  return pUpsert;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertOfIndex(Upsert *pUpsert, Index *pIdx){
  while(
      pUpsert
   && pUpsert->pUpsertTarget!=0
   && pUpsert->pUpsertIdx!=pIdx
  ){
     pUpsert = pUpsert->pNextUpsert;
  }
  return pUpsert;
}